

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

op_t * target_gen_post_call_res_code
                 (op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,type *ret_type,op_t res,
                 MIR_insn_t_conflict call,size_t call_ops_start)

{
  MIR_type_t t;
  gen_ctx_conflict *pgVar1;
  MIR_context_t ctx_00;
  int iVar2;
  MIR_insn_code_t code;
  MIR_op_t local_b8;
  MIR_op_t local_88;
  int local_58;
  int local_54;
  int n_qwords;
  int i;
  MIR_type_t qword_types [2];
  MIR_insn_t_conflict insn;
  MIR_type_t type;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  size_t call_ops_start_local;
  MIR_insn_t_conflict call_local;
  type *ret_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  ctx_00 = c2m_ctx->ctx;
  iVar2 = void_type_p(ret_type);
  if (iVar2 == 0) {
    local_58 = process_ret_type(c2m_ctx,ret_type,(MIR_type_t *)&n_qwords);
    if (local_58 != 0) {
      if ((res.mir_op._8_2_ & 0xff) != 10) {
        __assert_fail("res.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                      ,0x100,
                      "op_t target_gen_post_call_res_code(c2m_ctx_t, struct type *, op_t, MIR_insn_t, size_t)"
                     );
      }
      for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
        t = (&n_qwords)[local_54];
        code = tp_mov(t);
        MIR_new_mem_op(&local_88,ctx_00,t,res.mir_op.u.mem.disp + (local_54 << 3),
                       res.mir_op.u.mem.base,res.mir_op.u.mem.index,res.mir_op.u.mem.scale);
        VARR_MIR_op_tget(&local_b8,pgVar1->call_ops,(long)local_54 + call_ops_start + 2);
        qword_types = (MIR_type_t  [2])MIR_new_insn(ctx_00,code);
        MIR_append_insn(ctx_00,pgVar1->curr_func,(MIR_insn_t_conflict)qword_types);
      }
    }
    memcpy(__return_storage_ptr__,&res,0x40);
  }
  else {
    memcpy(__return_storage_ptr__,&res,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t target_gen_post_call_res_code (c2m_ctx_t c2m_ctx, struct type *ret_type, op_t res,
                                           MIR_insn_t call MIR_UNUSED, size_t call_ops_start) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_insn_t insn;
  MIR_type_t qword_types[MAX_QWORDS];
  int i, n_qwords;

  if (void_type_p (ret_type)) return res;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    assert (res.mir_op.mode == MIR_OP_MEM);
    for (i = 0; i < n_qwords; i++) {
      type = qword_types[i];
      insn = MIR_new_insn (ctx, tp_mov (type),
                           MIR_new_mem_op (ctx, type, res.mir_op.u.mem.disp + 8 * i,
                                           res.mir_op.u.mem.base, res.mir_op.u.mem.index,
                                           res.mir_op.u.mem.scale),
                           VARR_GET (MIR_op_t, call_ops, i + call_ops_start + 2));
      MIR_append_insn (ctx, curr_func, insn);
    }
  }
  return res;
}